

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_msg.h
# Opt level: O0

void __thiscall nodecpp::platform::internal_msg::InternalMsg::InternalMsg(InternalMsg *this)

{
  EVP_PKEY_CTX *in_RSI;
  InternalMsg *this_local;
  
  FirstHeader::FirstHeader(&this->firstHeader);
  this->pageCnt = 0;
  PagePtrWrapper::PagePtrWrapper(&this->lip);
  PagePtrWrapper::PagePtrWrapper(&this->currentPage);
  this->totalSz = 0;
  IndexPageHeader::init((IndexPageHeader *)this,in_RSI);
  memset((this->firstHeader).firstPages,0,0x20);
  return;
}

Assistant:

InternalMsg() { 
			firstHeader.init(); 
			memset( firstHeader.firstPages, 0, sizeof( firstHeader.firstPages ) );
		}